

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPretransformVertices.cpp
# Opt level: O2

void __thiscall PretransformVerticesTest::SetUp(PretransformVerticesTest *this)

{
  aiScene *this_00;
  aiMaterial **ppaVar1;
  aiMaterial *this_01;
  aiMesh **ppaVar2;
  aiMesh *this_02;
  ulong *puVar3;
  aiVector3D *paVar4;
  undefined4 *puVar5;
  aiNode *this_03;
  PretransformVertices *this_04;
  aiFace *paVar6;
  uint i;
  long lVar7;
  uint normalIdx;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint a;
  ulong uVar11;
  int local_48;
  
  this_00 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_00);
  this->mScene = this_00;
  this_00->mNumMaterials = 5;
  ppaVar1 = (aiMaterial **)operator_new__(0x28);
  this_00->mMaterials = ppaVar1;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    this->mScene->mMaterials[lVar7] = this_01;
  }
  this->mScene->mNumMeshes = 0x19;
  ppaVar2 = (aiMesh **)operator_new__(200);
  this->mScene->mMeshes = ppaVar2;
  for (uVar10 = 0; uVar10 != 0x19; uVar10 = uVar10 + 1) {
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    this->mScene->mMeshes[uVar10] = this_02;
    this_02->mPrimitiveTypes = 1;
    uVar9 = uVar10 + 10;
    this_02->mNumFaces = (uint)uVar9;
    puVar3 = (ulong *)operator_new__(uVar9 * 0x10 + 8);
    *puVar3 = uVar9;
    paVar6 = (aiFace *)(puVar3 + 1);
    do {
      paVar6->mNumIndices = 0;
      paVar6->mIndices = (uint *)0x0;
      paVar6 = paVar6 + 1;
    } while (paVar6 != (aiFace *)(puVar3 + uVar9 * 2 + 1));
    this_02->mFaces = (aiFace *)(puVar3 + 1);
    this_02->mNumVertices = (uint)uVar9;
    paVar4 = (aiVector3D *)operator_new__(uVar9 * 0xc);
    memset(paVar4,0,uVar10 * 0xc + 0x78);
    local_48 = (int)uVar10;
    this_02->mVertices = paVar4;
    lVar8 = 0;
    lVar7 = 2;
    for (uVar11 = 0; uVar11 < (uVar9 & 0xffffffff); uVar11 = uVar11 + 1) {
      paVar6 = this_02->mFaces;
      *(undefined4 *)((long)paVar6 + lVar7 * 4 + -8) = 1;
      puVar5 = (undefined4 *)operator_new__(4);
      *(undefined4 **)(&paVar6->mNumIndices + lVar7) = puVar5;
      *puVar5 = (int)lVar8;
      paVar4 = this_02->mVertices;
      (&paVar4->x)[lVar8] = (float)local_48;
      (&paVar4->y)[lVar8] = (float)(uVar11 & 0xffffffff);
      (&paVar4->z)[lVar8] = 0.0;
      uVar9 = (ulong)this_02->mNumFaces;
      lVar7 = lVar7 + 4;
      lVar8 = lVar8 + 3;
    }
    this_02->mMaterialIndex = (uint)((uVar10 & 0xffffffff) % 5);
    if ((uVar10 & 1) != 0) {
      uVar9 = (ulong)this_02->mNumVertices;
      paVar4 = (aiVector3D *)operator_new__(uVar9 * 0xc);
      if (uVar9 != 0) {
        uVar11 = uVar9 * 0xc - 0xc;
        memset(paVar4,0,(uVar11 - uVar11 % 0xc) + 0xc);
      }
      this_02->mNormals = paVar4;
      lVar7 = 0;
      for (uVar11 = 0; uVar11 < uVar9; uVar11 = uVar11 + 1) {
        *(undefined4 *)((long)&this_02->mNormals->x + lVar7) = 0x3f800000;
        *(undefined4 *)((long)&this_02->mNormals->y + lVar7) = 0x3f800000;
        *(undefined4 *)((long)&this_02->mNormals->z + lVar7) = 0x3f800000;
        aiVector3t<float>::Normalize((aiVector3t<float> *)((long)&this_02->mNormals->x + lVar7));
        uVar9 = (ulong)this_02->mNumVertices;
        lVar7 = lVar7 + 0xc;
      }
    }
  }
  this_03 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_03);
  this->mScene->mRootNode = this_03;
  aiString::Set(&this->mScene->mRootNode->mName,"Root");
  AddNodes(0,this->mScene->mRootNode,2);
  this_04 = (PretransformVertices *)operator_new(0x60);
  Assimp::PretransformVertices::PretransformVertices(this_04);
  this->mProcess = this_04;
  return;
}

Assistant:

void PretransformVerticesTest::SetUp() {
    mScene = new aiScene();

    // add 5 empty materials
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials = 5];
    for (unsigned int i = 0; i < 5;++i) {
        mScene->mMaterials[i] = new aiMaterial();
    }

    // add 25 test meshes
    mScene->mMeshes = new aiMesh*[mScene->mNumMeshes = 25];
    for ( unsigned int i = 0; i < 25; ++i) { 
        aiMesh* mesh = mScene->mMeshes[ i ] = new aiMesh();

        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        mesh->mFaces = new aiFace[ mesh->mNumFaces = 10+i ];
        mesh->mVertices = new aiVector3D[mesh->mNumVertices = mesh->mNumFaces];
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
            aiFace& f = mesh->mFaces[ a ];
            f.mIndices = new unsigned int [ f.mNumIndices = 1 ];
            f.mIndices[0] = a*3;

            mesh->mVertices[a] = aiVector3D((float)i,(float)a,0.f);
        }
        mesh->mMaterialIndex = i%5;

        if (i % 2) {
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            for ( unsigned int normalIdx=0; normalIdx<mesh->mNumVertices; ++normalIdx ) {
                mesh->mNormals[ normalIdx ].x = 1.0f;
                mesh->mNormals[ normalIdx ].y = 1.0f;
                mesh->mNormals[ normalIdx ].z = 1.0f;
                mesh->mNormals[ normalIdx ].Normalize();
            }
        }
    }

    // construct some nodes (1+25)
    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mName.Set("Root");
    AddNodes(0, mScene->mRootNode, 2);

    mProcess = new PretransformVertices();
}